

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnAtomicWait
          (SharedValidator *this,Location *loc,Opcode opcode,Address alignment)

{
  undefined8 alignment_00;
  Result RVar1;
  Address natural_alignment;
  Var local_90;
  Enum local_44;
  undefined1 local_40 [8];
  MemoryType mt;
  Address alignment_local;
  Location *loc_local;
  SharedValidator *this_local;
  Opcode opcode_local;
  Result result;
  
  mt.limits._16_8_ = alignment;
  this_local._0_4_ = opcode.enum_;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  MemoryType::MemoryType((MemoryType *)local_40);
  this->expr_loc_ = loc;
  Var::Var(&local_90,0,loc);
  local_44 = (Enum)CheckMemoryIndex(this,&local_90,(MemoryType *)local_40);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_44);
  Var::~Var(&local_90);
  alignment_00 = mt.limits._16_8_;
  natural_alignment = Opcode::GetMemorySize((Opcode *)&this_local);
  RVar1 = CheckAtomicAlign(this,loc,alignment_00,natural_alignment);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = TypeChecker::OnAtomicWait(&this->typechecker_,this_local._0_4_,(Limits *)local_40);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnAtomicWait(const Location& loc,
                                     Opcode opcode,
                                     Address alignment) {
  Result result = Result::Ok;
  MemoryType mt;
  expr_loc_ = &loc;
  result |= CheckMemoryIndex(Var(0, loc), &mt);
  result |= CheckAtomicAlign(loc, alignment, opcode.GetMemorySize());
  result |= typechecker_.OnAtomicWait(opcode, mt.limits);
  return result;
}